

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  OfType OVar4;
  ColourImpl *colourImpl_;
  ostream *poVar5;
  undefined1 local_58 [8];
  AssertionPrinter printer;
  bool printInfoMessages;
  AssertionResult *result;
  AssertionStats *_assertionStats_local;
  CompactReporter *this_local;
  
  printer.colourImpl._7_1_ = 1;
  uVar3 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  if (((uVar3 & 1) == 0) &&
     (bVar2 = AssertionResult::isOk(&_assertionStats->assertionResult), bVar2)) {
    OVar4 = AssertionResult::getResultType(&_assertionStats->assertionResult);
    if ((OVar4 != Warning) &&
       (OVar4 = AssertionResult::getResultType(&_assertionStats->assertionResult),
       OVar4 != ExplicitSkip)) {
      return;
    }
    printer.colourImpl._7_1_ = 0;
  }
  bVar1 = printer.colourImpl._7_1_;
  poVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  colourImpl_ = Detail::unique_ptr<Catch::ColourImpl>::get
                          (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
  anon_unknown_26::AssertionPrinter::AssertionPrinter
            ((AssertionPrinter *)local_58,poVar5,_assertionStats,(bool)(bVar1 & 1),colourImpl_);
  anon_unknown_26::AssertionPrinter::print((AssertionPrinter *)local_58);
  poVar5 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void CompactReporter::assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip )
                    return;
                printInfoMessages = false;
            }

            AssertionPrinter printer( m_stream, _assertionStats, printInfoMessages, m_colour.get() );
            printer.print();

            m_stream << '\n' << std::flush;
        }